

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acec2Mult.c
# Opt level: O2

void Sdb_StoMergeCuts(Sdb_Sto_t *p,int iObj)

{
  Sdb_Cut_t **ppSVar1;
  word *pwVar2;
  word *pwVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Gia_Man_t *p_00;
  uint *puVar8;
  Sdb_Cut_t *pSVar9;
  word awVar10 [1];
  int i;
  uint uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  Gia_Obj_t *pObj;
  long lVar19;
  ulong uVar20;
  word *pwVar21;
  word wVar22;
  word wVar23;
  word *pwVar24;
  Sdb_Cut_t *pSVar25;
  long lVar26;
  ulong uVar27;
  Vec_Int_t *p_01;
  byte bVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  int iVar33;
  Sdb_Cut_t **ppSVar34;
  uint uVar35;
  uint uVar36;
  Sdb_Cut_t *t;
  long lVar37;
  ulong uVar38;
  Sdb_Cut_t *pSVar39;
  int *piVar40;
  int *piVar41;
  ulong uVar42;
  int iVar43;
  ulong uVar44;
  int iVar45;
  int iVar46;
  int *piVar47;
  uint uVar48;
  uint uVar49;
  ulong uVar50;
  uint uVar51;
  Sdb_Cut_t *pSVar52;
  bool bVar53;
  bool bVar54;
  word uTruth [1];
  ulong local_e8;
  int *local_80;
  ulong local_50;
  word uTruth0 [1];
  
  pObj = Gia_ManObj(p->pGia,iObj);
  uVar29 = (uint)*(undefined8 *)pObj;
  bVar54 = (~uVar29 & 0x1fffffff) != 0;
  uVar11 = uVar29 & 0x1fffffff;
  uVar15 = (uint)((ulong)*(undefined8 *)pObj >> 0x20);
  uVar30 = uVar15 & 0x1fffffff;
  uVar49 = p->nCutSize;
  iVar5 = p->nCutNum;
  iVar12 = Sdb_StoPrepareSet(p,iObj - uVar11,0);
  iVar13 = Sdb_StoPrepareSet(p,iObj - uVar30,1);
  uVar31 = (uint)*(undefined8 *)pObj;
  if (((-1 < (int)uVar31) && (uVar31 = uVar31 & 0x1fffffff, uVar31 != 0x1fffffff)) &&
     (uVar31 == ((uint)((ulong)*(undefined8 *)pObj >> 0x20) & 0x1fffffff))) {
    __assert_fail("!Gia_ObjIsBuf(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acec2Mult.c"
                  ,0x2e4,"void Sdb_StoMergeCuts(Sdb_Sto_t *, int)");
  }
  p_00 = p->pGia;
  iVar14 = Gia_ObjId(p_00,pObj);
  puVar8 = p_00->pMuxes;
  if ((puVar8 != (uint *)0x0) && (puVar8[iVar14] != 0)) {
    __assert_fail("!Gia_ObjIsMux(p->pGia, pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acec2Mult.c"
                  ,0x2e5,"void Sdb_StoMergeCuts(Sdb_Sto_t *, int)");
  }
  uVar31 = uVar29 >> 0x1d & 1;
  uVar15 = uVar15 >> 0x1d & 1;
  ppSVar1 = p->ppCuts;
  ppSVar34 = ppSVar1;
  for (lVar19 = 0x1358; lVar19 != 0x1ce8; lVar19 = lVar19 + 0x30) {
    *ppSVar34 = (Sdb_Cut_t *)((long)(p->pCuts + -1) + 0x958 + lVar19);
    ppSVar34 = ppSVar34 + 1;
  }
  p->CutCount[0] = (double)(iVar13 * iVar12) + p->CutCount[0];
  pSVar52 = p->pCuts[0];
  uVar27 = 0;
  if (iVar13 < 1) {
    iVar13 = 0;
  }
  uVar16 = iVar5 - 1;
  if (iVar12 < 1) {
    iVar12 = 0;
  }
  local_80 = p->pCuts[0][0].pLeaves;
  iVar14 = 0;
  do {
    if (iVar14 == iVar12) {
      uVar49 = (uint)uVar27;
      p->CutCount[3] = (double)(int)uVar49 + p->CutCount[3];
      p->nCutsOver = p->nCutsOver + (uint)(uVar49 == uVar16);
      p->nCutsR = uVar49;
      p->Pivot = iObj;
      if (((int)uVar49 < 1) || (iVar5 <= (int)uVar49)) {
        __assert_fail("nCutsR > 0 && nCutsR < nCutNum",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acec2Mult.c"
                      ,0x305,"void Sdb_StoMergeCuts(Sdb_Sto_t *, int)");
      }
      uVar20 = 0;
      do {
        if (uVar20 == uVar27) {
          p_01 = Vec_WecEntry(p->vCuts,iObj);
          Vec_IntPush(p_01,uVar49);
          for (uVar20 = 0; uVar20 != uVar27; uVar20 = uVar20 + 1) {
            Vec_IntPush(p_01,*(uint *)&ppSVar1[uVar20]->field_0x14 >> 0x1c);
            for (uVar38 = 0; pSVar52 = ppSVar1[uVar20],
                uVar38 < *(uint *)&pSVar52->field_0x14 >> 0x1c; uVar38 = uVar38 + 1) {
              Vec_IntPush(p_01,pSVar52->pLeaves[uVar38]);
            }
            Vec_IntPush(p_01,pSVar52->iFunc);
          }
          if ((uVar49 != 1) || (0x1fffffff < *(uint *)&(*ppSVar1)->field_0x14)) {
            Sdb_CutAddUnit(p,iObj);
          }
          return;
        }
        pSVar52 = ppSVar1[uVar20];
        uVar11 = *(uint *)&pSVar52->field_0x14;
        if (0x6fffffff < uVar11) {
          __assert_fail("pCut0->nLeaves <= SDB_MAX_CUTSIZE",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acec2Mult.c"
                        ,0x16d,"int Sdb_CutSetCheckArray(Sdb_Cut_t **, int)");
        }
        wVar22 = pSVar52->Sign;
        wVar23 = Sdb_CutGetSign(pSVar52);
        if (wVar22 != wVar23) {
          __assert_fail("pCut0->Sign == Sdb_CutGetSign(pCut0)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acec2Mult.c"
                        ,0x16e,"int Sdb_CutSetCheckArray(Sdb_Cut_t **, int)");
        }
        uVar50 = (ulong)(uVar11 >> 0x1c);
        piVar47 = pSVar52->pLeaves;
        lVar19 = 1;
        uVar38 = 0;
        while (piVar47 = piVar47 + 1, uVar38 != uVar50) {
          lVar26 = 0;
          while ((ulong)(lVar19 + lVar26) < uVar50) {
            piVar40 = piVar47 + lVar26;
            lVar26 = lVar26 + 1;
            if (*piVar40 <= pSVar52->pLeaves[uVar38]) {
              __assert_fail("pCut0->pLeaves[m] < pCut0->pLeaves[n]",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acec2Mult.c"
                            ,0x172,"int Sdb_CutSetCheckArray(Sdb_Cut_t **, int)");
            }
          }
          lVar19 = lVar19 + 1;
          uVar38 = uVar38 + 1;
        }
        for (uVar38 = 0; uVar38 != uVar27; uVar38 = uVar38 + 1) {
          pSVar39 = ppSVar1[uVar38];
          if (pSVar52 != pSVar39) {
            uVar42 = 0;
            do {
              if (uVar42 == *(uint *)&pSVar39->field_0x14 >> 0x1c) {
                __assert_fail("Value == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acec2Mult.c"
                              ,0x17b,"int Sdb_CutSetCheckArray(Sdb_Cut_t **, int)");
              }
              uVar44 = 0;
              do {
                if (uVar50 == uVar44) goto LAB_005494ba;
                piVar47 = pSVar52->pLeaves + uVar44;
                uVar44 = uVar44 + 1;
              } while (pSVar39->pLeaves[uVar42] != *piVar47);
              uVar42 = uVar42 + 1;
            } while( true );
          }
LAB_005494ba:
        }
        uVar20 = uVar20 + 1;
      } while( true );
    }
    pSVar39 = p->pCuts[1];
    piVar47 = p->pCuts[1][0].pLeaves;
    for (iVar33 = 0; iVar33 != iVar13; iVar33 = iVar33 + 1) {
      uVar48 = (uint)uVar27;
      if (((int)uVar49 <
           (int)((*(uint *)&pSVar39->field_0x14 >> 0x1c) + (*(uint *)&pSVar52->field_0x14 >> 0x1c)))
         && (uVar20 = pSVar39->Sign | pSVar52->Sign,
            uVar20 = uVar20 - (uVar20 >> 1 & 0x5555555555555555),
            uVar20 = (uVar20 >> 2 & 0x3333333333333333) + (uVar20 & 0x3333333333333333),
            (int)uVar49 <
            (int)(uint)(byte)(((uVar20 >> 4) + uVar20 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >>
                             0x38))) goto LAB_0054931c;
      p->CutCount[1] = p->CutCount[1] + 1.0;
      lVar19 = (long)(int)uVar48;
      pSVar25 = p->ppCuts[lVar19];
      uVar32 = *(uint *)&pSVar52->field_0x14 >> 0x1c;
      uVar35 = *(uint *)&pSVar39->field_0x14 >> 0x1c;
      piVar40 = pSVar39->pLeaves;
      if ((uVar32 == uVar49) && (uVar35 == uVar49)) {
        for (uVar20 = 0; uVar18 = uVar49, uVar49 != uVar20; uVar20 = uVar20 + 1) {
          if (local_80[uVar20] != piVar47[uVar20]) goto LAB_0054931c;
          pSVar25->pLeaves[uVar20] = local_80[uVar20];
        }
LAB_00548ac8:
        *(uint *)&pSVar25->field_0x14 = *(uint *)&pSVar25->field_0x14 & 0xfffffff | uVar18 << 0x1c;
        pSVar25->iFunc = -1;
        pSVar25->Sign = pSVar39->Sign | pSVar52->Sign;
        uVar20 = 0;
        if (0 < (int)uVar48) {
          uVar20 = uVar27;
        }
        for (uVar38 = 0; uVar20 != uVar38; uVar38 = uVar38 + 1) {
          pSVar25 = p->ppCuts[uVar38];
          pSVar9 = p->ppCuts[lVar19];
          if (((*(uint *)&pSVar25->field_0x14 >> 0x1c <= *(uint *)&pSVar9->field_0x14 >> 0x1c) &&
              ((pSVar25->Sign & ~pSVar9->Sign) == 0)) &&
             (iVar17 = Sdb_CutSetCutIsContainedOrder(pSVar9,pSVar25), iVar17 != 0))
          goto LAB_0054931c;
        }
        p->CutCount[2] = p->CutCount[2] + 1.0;
        pSVar25 = p->ppCuts[lVar19];
        if (p->fCutMin != 0) {
          uVar32 = p->nCutSize;
          if ((int)uVar32 < 7) {
            uVar32 = *(uint *)&pSVar25->field_0x14;
            pwVar21 = Sdb_CutTruth(p,pSVar52);
            uVar38 = *pwVar21;
            pwVar21 = Sdb_CutTruth(p,pSVar39);
            uVar50 = *pwVar21;
            uVar35 = Abc_LitIsCompl(pSVar52->iFunc);
            uVar18 = Abc_LitIsCompl(pSVar39->iFunc);
            piVar41 = pSVar25->pLeaves;
            wVar22 = Abc_Tt6Expand(-(ulong)(uVar35 != uVar31) ^ uVar38,pSVar52->pLeaves,
                                   *(uint *)&pSVar52->field_0x14 >> 0x1c,piVar41,
                                   *(uint *)&pSVar25->field_0x14 >> 0x1c);
            wVar23 = Abc_Tt6Expand(-(ulong)(uVar18 != uVar15) ^ uVar50,piVar40,
                                   *(uint *)&pSVar39->field_0x14 >> 0x1c,piVar41,
                                   *(uint *)&pSVar25->field_0x14 >> 0x1c);
            local_e8 = wVar23 & wVar22;
            if ((-1 < (int)uVar29 && bVar54) && uVar11 < uVar30) {
              local_e8 = wVar23 ^ wVar22;
            }
            uVar35 = (uint)local_e8 & 1;
            local_e8 = -(ulong)uVar35 ^ local_e8;
            uTruth[0] = local_e8;
            if (p->fTruthMin != 0) {
              uVar51 = *(uint *)&pSVar25->field_0x14 >> 0x1c;
              pwVar21 = s_Truths6Neg;
              uVar18 = 0;
              uVar38 = local_e8;
              for (uVar50 = 0; uVar51 != uVar50; uVar50 = uVar50 + 1) {
                if ((*pwVar21 & (uVar38 >> ((byte)(1 << ((byte)uVar50 & 0x1f)) & 0x3f) ^ uVar38)) !=
                    0) {
                  if ((long)(int)uVar18 < (long)uVar50) {
                    piVar41[(int)uVar18] = piVar41[uVar50];
                    uVar38 = Abc_Tt6SwapVars(uVar38,uVar18,(int)uVar50);
                  }
                  uVar18 = uVar18 + 1;
                }
                pwVar21 = pwVar21 + 1;
              }
              awVar10[0] = uTruth[0];
              if ((uVar18 != uVar51) &&
                 (awVar10[0] = uVar38, local_e8 = uVar38, (int)uVar51 <= (int)uVar18)) {
                __assert_fail("k < nVars",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                              ,0x754,"int Abc_Tt6MinBase(word *, int *, int)");
              }
              uTruth[0] = awVar10[0];
              *(uint *)&pSVar25->field_0x14 =
                   *(uint *)&pSVar25->field_0x14 & 0xfffffff | uVar18 << 0x1c;
            }
            if ((local_e8 & 1) != 0) {
              __assert_fail("(int)(t & 1) == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acec2Mult.c"
                            ,0x256,
                            "int Sdb_CutComputeTruth6(Sdb_Sto_t *, Sdb_Cut_t *, Sdb_Cut_t *, int, int, Sdb_Cut_t *, int)"
                           );
            }
            uVar32 = uVar32 >> 0x1c;
            iVar17 = Vec_MemHashInsert(p->vTtMem,uTruth);
            iVar17 = Abc_Var2Lit(iVar17,uVar35);
            pSVar25->iFunc = iVar17;
            uVar35 = *(uint *)&pSVar25->field_0x14 >> 0x1c;
            bVar53 = uVar35 < uVar32;
            if (uVar32 < uVar35) {
              __assert_fail("(int)pCutR->nLeaves <= nOldSupp",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acec2Mult.c"
                            ,0x259,
                            "int Sdb_CutComputeTruth6(Sdb_Sto_t *, Sdb_Cut_t *, Sdb_Cut_t *, int, int, Sdb_Cut_t *, int)"
                           );
            }
          }
          else {
            uVar35 = *(uint *)&pSVar25->field_0x14;
            bVar28 = (char)uVar32 - 6U & 0x1f;
            uVar51 = 1 << bVar28;
            pwVar21 = Sdb_CutTruth(p,pSVar52);
            pwVar24 = Sdb_CutTruth(p,pSVar39);
            uVar18 = Abc_LitIsCompl(pSVar52->iFunc);
            Abc_TtCopy(uTruth0,pwVar21,uVar51,uVar18 ^ uVar31);
            uVar18 = Abc_LitIsCompl(pSVar39->iFunc);
            Abc_TtCopy(&local_50,pwVar24,uVar51,uVar18 ^ uVar15);
            piVar41 = pSVar25->pLeaves;
            Abc_TtExpand(uTruth0,uVar32,pSVar52->pLeaves,*(uint *)&pSVar52->field_0x14 >> 0x1c,
                         piVar41,*(uint *)&pSVar25->field_0x14 >> 0x1c);
            Abc_TtExpand(&local_50,uVar32,piVar40,*(uint *)&pSVar39->field_0x14 >> 0x1c,piVar41,
                         *(uint *)&pSVar25->field_0x14 >> 0x1c);
            uVar38 = 0;
            if (0 < 1 << bVar28) {
              uVar38 = (ulong)uVar51;
            }
            if ((-1 < (int)uVar29 && bVar54) && uVar11 < uVar30) {
              uTruth[0] = local_50 ^ uTruth0[0];
            }
            else {
              uTruth[0] = local_50 & uTruth0[0];
            }
            bVar53 = (uTruth[0] & 1) != 0;
            if (bVar53) {
              uTruth[0] = ~uTruth[0];
            }
            else {
            }
            if (p->fTruthMin != 0) {
              uVar18 = *(uint *)&pSVar25->field_0x14 >> 0x1c;
              if (uVar32 < uVar18) {
                __assert_fail("nVars <= nVarsAll",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                              ,0x75b,"int Abc_TtMinBase(word *, int *, int, int)");
              }
              iVar17 = 0;
              for (uVar50 = 0; uVar50 != uVar18; uVar50 = uVar50 + 1) {
                if (uVar50 < 6) {
                  lVar26 = uVar38 + 1;
                  do {
                    lVar26 = lVar26 + -1;
                    if (lVar26 == 0) goto LAB_005490d9;
                  } while ((s_Truths6Neg[uVar50] &
                           (uTruth[0] >> ((byte)(1 << ((byte)uVar50 & 0x1f)) & 0x3f) ^ uTruth[0]))
                           == 0);
LAB_00549091:
                  if ((long)iVar17 < (long)uVar50) {
                    piVar41[iVar17] = piVar41[uVar50];
                    Abc_TtSwapVars(uTruth,uVar32,iVar17,(int)uVar50);
                  }
                  iVar17 = iVar17 + 1;
                }
                else {
                  bVar28 = (byte)uVar50 - 6;
                  uVar42 = (ulong)(uint)(1 << (bVar28 & 0x1f));
                  uVar36 = 2 << (bVar28 & 0x1f);
                  pwVar24 = uTruth + uVar42;
                  for (pwVar21 = uTruth; pwVar21 < uTruth + (int)uVar51; pwVar21 = pwVar21 + uVar36)
                  {
                    uVar44 = 0;
                    while (uVar42 != uVar44) {
                      pwVar2 = pwVar21 + uVar44;
                      pwVar3 = pwVar24 + uVar44;
                      uVar44 = uVar44 + 1;
                      if (*pwVar2 != *pwVar3) goto LAB_00549091;
                    }
                    pwVar24 = pwVar24 + uVar36;
                  }
                }
LAB_005490d9:
              }
              if ((int)uVar18 < iVar17) {
                __assert_fail("k < nVars",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                              ,0x769,"int Abc_TtMinBase(word *, int *, int, int)");
              }
              *(uint *)&pSVar25->field_0x14 =
                   *(uint *)&pSVar25->field_0x14 & 0xfffffff | iVar17 << 0x1c;
            }
            if ((uTruth[0] & 1) != 0) {
              __assert_fail("(uTruth[0] & 1) == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acec2Mult.c"
                            ,0x271,
                            "int Sdb_CutComputeTruth(Sdb_Sto_t *, Sdb_Cut_t *, Sdb_Cut_t *, int, int, Sdb_Cut_t *, int)"
                           );
            }
            uVar35 = uVar35 >> 0x1c;
            iVar17 = Vec_MemHashInsert(p->vTtMem,uTruth);
            local_e8._0_4_ = (uint)bVar53;
            iVar17 = Abc_Var2Lit(iVar17,(uint)local_e8);
            pSVar25->iFunc = iVar17;
            uVar32 = *(uint *)&pSVar25->field_0x14 >> 0x1c;
            bVar53 = uVar32 < uVar35;
            if (!bVar53 && uVar32 != uVar35) {
              __assert_fail("(int)pCutR->nLeaves <= nOldSupp",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acec2Mult.c"
                            ,0x275,
                            "int Sdb_CutComputeTruth(Sdb_Sto_t *, Sdb_Cut_t *, Sdb_Cut_t *, int, int, Sdb_Cut_t *, int)"
                           );
            }
          }
          pSVar25 = ppSVar1[lVar19];
          if (bVar53) {
            wVar22 = Sdb_CutGetSign(pSVar25);
            pSVar25->Sign = wVar22;
          }
        }
        uVar32 = Sdb_CutTreeLeaves(p,pSVar25);
        *(uint *)&p->ppCuts[lVar19]->field_0x14 =
             *(uint *)&p->ppCuts[lVar19]->field_0x14 & 0xf0000000 | uVar32 & 0xfffffff;
        bVar53 = uVar48 != 0;
        uVar48 = 1;
        if (bVar53) {
          bVar53 = false;
          for (uVar38 = 0; uVar20 != uVar38; uVar38 = uVar38 + 1) {
            pSVar25 = ppSVar1[lVar19];
            pSVar9 = ppSVar1[uVar38];
            if (((*(uint *)&pSVar25->field_0x14 >> 0x1c < *(uint *)&pSVar9->field_0x14 >> 0x1c) &&
                ((pSVar25->Sign & ~pSVar9->Sign) == 0)) &&
               (iVar17 = Sdb_CutSetCutIsContainedOrder(pSVar9,pSVar25), iVar17 != 0)) {
              *(uint *)&ppSVar1[uVar38]->field_0x14 =
                   *(uint *)&ppSVar1[uVar38]->field_0x14 | 0xf0000000;
              bVar53 = true;
            }
          }
          if (bVar53) {
            if (lVar19 < 0) {
              lVar19 = -1;
            }
            iVar17 = 0;
            for (lVar26 = 0; lVar19 + 1 != lVar26; lVar26 = lVar26 + 1) {
              if (*(uint *)&ppSVar1[lVar26]->field_0x14 < 0xf0000000) {
                lVar37 = (long)iVar17;
                if (lVar37 < lVar26) {
                  pSVar25 = ppSVar1[lVar37];
                  ppSVar1[lVar37] = ppSVar1[lVar26];
                  ppSVar1[lVar26] = pSVar25;
                }
                iVar17 = iVar17 + 1;
              }
            }
            uVar27 = (ulong)(iVar17 - 1);
          }
          iVar17 = (int)uVar27;
          if (iVar17 < 0) {
            __assert_fail("nCuts >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acec2Mult.c"
                          ,0x238,"int Sdb_CutSetAddCut(Sdb_Cut_t **, int, int)");
          }
          for (; 0 < (int)uVar27; uVar27 = (ulong)((int)uVar27 - 1)) {
            pSVar25 = p->ppCuts[uVar27 - 1];
            uVar48 = *(uint *)&pSVar25->field_0x14;
            uVar35 = uVar48 & 0xfffffff;
            uVar32 = *(uint *)&ppSVar1[uVar27]->field_0x14;
            uVar18 = uVar32 & 0xfffffff;
            if ((uVar35 < uVar18) || ((uVar35 <= uVar18 && (uVar48 >> 0x1c < uVar32 >> 0x1c))))
            break;
            p->ppCuts[uVar27 - 1] = ppSVar1[uVar27];
            ppSVar1[uVar27] = pSVar25;
          }
          uVar48 = iVar17 + 1;
          if ((int)uVar16 <= (int)uVar48) {
            uVar48 = uVar16;
          }
        }
      }
      else {
        iVar17 = 0;
        uVar18 = 0;
        if (*(uint *)&pSVar52->field_0x14 < 0x10000000) {
LAB_00548a91:
          if ((int)(uVar18 + uVar35) <= (int)(iVar17 + uVar49)) {
            piVar41 = pSVar25->pLeaves + (int)uVar18;
            for (lVar26 = (long)iVar17; lVar26 < (long)(ulong)uVar35; lVar26 = lVar26 + 1) {
              *piVar41 = piVar47[lVar26];
              uVar18 = uVar18 + 1;
              piVar41 = piVar41 + 1;
            }
            goto LAB_00548ac8;
          }
        }
        else {
          iVar45 = 0;
          uVar18 = 0;
          if (0xfffffff < *(uint *)&pSVar39->field_0x14) {
            iVar17 = 0;
            uVar20 = 0;
            lVar26 = 0;
            do {
              while( true ) {
                iVar45 = (int)uVar20;
                lVar37 = 0;
                while( true ) {
                  if ((ulong)uVar49 - lVar26 == lVar37) goto LAB_0054931c;
                  iVar6 = local_80[iVar45 + lVar37];
                  iVar7 = piVar40[iVar17];
                  iVar46 = (int)lVar37;
                  iVar43 = (int)lVar26;
                  if (iVar7 <= iVar6) break;
                  pSVar25->pLeaves[lVar26 + lVar37] = iVar6;
                  lVar37 = lVar37 + 1;
                  if ((int)uVar32 <= (int)lVar37 + iVar45) goto LAB_0054934b;
                }
                lVar4 = lVar26 + 1 + lVar37;
                if (iVar6 <= iVar7) break;
                iVar17 = iVar17 + 1;
                pSVar25->pLeaves[lVar26 + lVar37] = iVar7;
                if ((int)uVar35 <= iVar17) {
                  iVar45 = iVar45 + iVar46;
                  goto LAB_00549374;
                }
                uVar20 = (ulong)(uint)(iVar45 + iVar46);
                lVar26 = lVar4;
              }
              uVar20 = (uVar20 & 0xffffffff) + lVar37 + 1;
              pSVar25->pLeaves[lVar26 + lVar37] = iVar6;
              iVar17 = iVar17 + 1;
              if ((int)uVar32 <= (int)uVar20) {
LAB_0054934b:
                uVar18 = iVar43 + iVar46 + 1;
                goto LAB_00548a91;
              }
              lVar26 = lVar4;
            } while (iVar17 < (int)uVar35);
            iVar45 = iVar45 + iVar46 + 1;
LAB_00549374:
            uVar18 = iVar43 + iVar46 + 1;
          }
          if ((int)(uVar18 + uVar32) <= (int)(iVar45 + uVar49)) {
            piVar41 = pSVar25->pLeaves + (int)uVar18;
            for (lVar26 = (long)iVar45; lVar26 < (long)(ulong)uVar32; lVar26 = lVar26 + 1) {
              *piVar41 = local_80[lVar26];
              uVar18 = uVar18 + 1;
              piVar41 = piVar41 + 1;
            }
            goto LAB_00548ac8;
          }
        }
      }
LAB_0054931c:
      pSVar39 = pSVar39 + 1;
      piVar47 = piVar47 + 0xc;
      uVar27 = (ulong)uVar48;
    }
    iVar14 = iVar14 + 1;
    pSVar52 = pSVar52 + 1;
    local_80 = local_80 + 0xc;
  } while( true );
}

Assistant:

void Sdb_StoMergeCuts( Sdb_Sto_t * p, int iObj )
{
    Gia_Obj_t * pObj = Gia_ManObj(p->pGia, iObj);
    int fIsXor       = Gia_ObjIsXor(pObj);
    int nCutSize     = p->nCutSize;
    int nCutNum      = p->nCutNum;
    int fComp0       = Gia_ObjFaninC0(pObj);
    int fComp1       = Gia_ObjFaninC1(pObj);
    int Fan0         = Gia_ObjFaninId0(pObj, iObj);
    int Fan1         = Gia_ObjFaninId1(pObj, iObj);
    int nCuts0       = Sdb_StoPrepareSet( p, Fan0, 0 );
    int nCuts1       = Sdb_StoPrepareSet( p, Fan1, 1 );
    int i, k, nCutsR = 0;
    Sdb_Cut_t * pCut0, * pCut1, ** pCutsR = p->ppCuts;
    assert( !Gia_ObjIsBuf(pObj) );
    assert( !Gia_ObjIsMux(p->pGia, pObj) );
    Sdb_StoInitResult( p );
    p->CutCount[0] += nCuts0 * nCuts1;
    for ( i = 0, pCut0 = p->pCuts[0]; i < nCuts0; i++, pCut0++ )
    for ( k = 0, pCut1 = p->pCuts[1]; k < nCuts1; k++, pCut1++ )
    {
        if ( (int)(pCut0->nLeaves + pCut1->nLeaves) > nCutSize && Sdb_CutCountBits(pCut0->Sign | pCut1->Sign) > nCutSize )
            continue;
        p->CutCount[1]++; 
        if ( !Sdb_CutMergeOrder(pCut0, pCut1, pCutsR[nCutsR], nCutSize) )
            continue;
        if ( Sdb_CutSetLastCutIsContained(pCutsR, nCutsR) )
            continue;
        p->CutCount[2]++;
        if ( p->fCutMin && Sdb_CutComputeTruth(p, pCut0, pCut1, fComp0, fComp1, pCutsR[nCutsR], fIsXor) )
            pCutsR[nCutsR]->Sign = Sdb_CutGetSign(pCutsR[nCutsR]);
        pCutsR[nCutsR]->nTreeLeaves = Sdb_CutTreeLeaves( p, pCutsR[nCutsR] );
        nCutsR = Sdb_CutSetAddCut( pCutsR, nCutsR, nCutNum );
    }
    p->CutCount[3] += nCutsR;
    p->nCutsOver += nCutsR == nCutNum-1;
    p->nCutsR = nCutsR;
    p->Pivot = iObj;
    // debug printout
    if ( 0 )
    {
        printf( "*** Obj = %4d  NumCuts = %4d\n", iObj, nCutsR );
        for ( i = 0; i < nCutsR; i++ )
            Sdb_CutPrint( p, iObj, pCutsR[i] );
        printf( "\n" );
    }
    // verify
    assert( nCutsR > 0 && nCutsR < nCutNum );
    assert( Sdb_CutSetCheckArray(pCutsR, nCutsR) );
    // store the cutset
    Sdb_StoStoreResult( p, iObj, pCutsR, nCutsR );
    if ( nCutsR > 1 || pCutsR[0]->nLeaves > 1 )
        Sdb_CutAddUnit( p, iObj );
}